

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int cuddEstimateCofactor(DdManager *dd,st__table *table,DdNode *node,int i,int phase,DdNode **ptr)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *local_58;
  DdNode *ptrE;
  DdNode *ptrT;
  int local_40;
  int val;
  int eval;
  int tval;
  DdNode **ptr_local;
  int phase_local;
  int i_local;
  DdNode *node_local;
  st__table *table_local;
  DdManager *dd_local;
  
  _eval = ptr;
  ptr_local._0_4_ = phase;
  ptr_local._4_4_ = i;
  _phase_local = node;
  node_local = (DdNode *)table;
  table_local = (st__table *)dd;
  if (((ulong)node->next & 1) != 0) {
    iVar1 = st__lookup(table,(char *)node,(char **)ptr);
    if (iVar1 == 0) {
      iVar1 = st__add_direct((st__table *)node_local,(char *)_phase_local,(char *)_phase_local);
      if (iVar1 == -10000) {
        return -1;
      }
      *_eval = _phase_local;
    }
    return 0;
  }
  node->next = (DdNode *)((ulong)node->next ^ 1);
  if (node->index != 0x7fffffff) {
    if (node->index == i) {
      if (phase == 1) {
        *ptr = (DdNode *)(node->type).value;
        ptrT._4_4_ = ddDagInt((node->type).kids.T);
      }
      else {
        *ptr = (node->type).kids.E;
        ptrT._4_4_ = ddDagInt((DdNode *)((ulong)(node->type).kids.E & 0xfffffffffffffffe));
      }
      if ((1 < _phase_local->ref) &&
         (iVar1 = st__add_direct((st__table *)node_local,(char *)_phase_local,(char *)*_eval),
         iVar1 == -10000)) {
        return -1;
      }
      return ptrT._4_4_;
    }
    if (dd->perm[i] < dd->perm[node->index]) {
      *ptr = node;
      val = ddDagInt((node->type).kids.T);
      local_40 = ddDagInt((DdNode *)((ulong)(_phase_local->type).kids.E & 0xfffffffffffffffe));
      if ((1 < _phase_local->ref) &&
         (iVar1 = st__add_direct((st__table *)node_local,(char *)_phase_local,(char *)_phase_local),
         iVar1 == -10000)) {
        return -1;
      }
      return val + 1 + local_40;
    }
    val = cuddEstimateCofactor(dd,table,(node->type).kids.T,i,phase,&ptrE);
    local_40 = cuddEstimateCofactor
                         ((DdManager *)table_local,(st__table *)node_local,
                          (DdNode *)((ulong)(_phase_local->type).kids.E & 0xfffffffffffffffe),
                          ptr_local._4_4_,(int)ptr_local,&local_58);
    local_58 = (DdNode *)
               ((ulong)local_58 ^
               (long)(int)((uint)*(undefined8 *)((long)&_phase_local->type + 8) & 1));
    if (ptrE == local_58) {
      *_eval = ptrE;
      ptrT._4_4_ = val;
      if ((1 < _phase_local->ref) &&
         (iVar1 = st__add_direct((st__table *)node_local,(char *)_phase_local,(char *)*_eval),
         iVar1 == -10000)) {
        return -1;
      }
    }
    else {
      if ((ptrE != (_phase_local->type).kids.T) || (local_58 != (_phase_local->type).kids.E)) {
        pDVar2 = cuddUniqueLookup((DdManager *)table_local,_phase_local->index,ptrE,local_58);
        *_eval = pDVar2;
        if (pDVar2 != (DdNode *)0x0) {
          if (((ulong)(*_eval)->next & 1) == 0) {
            ptrT._4_4_ = val + 1 + local_40;
          }
          else {
            ptrT._4_4_ = 0;
          }
          if (_phase_local->ref < 2) {
            return ptrT._4_4_;
          }
          iVar1 = st__add_direct((st__table *)node_local,(char *)_phase_local,(char *)*_eval);
          if (iVar1 != -10000) {
            return ptrT._4_4_;
          }
          return -1;
        }
      }
      *_eval = _phase_local;
      ptrT._4_4_ = val + 1 + local_40;
    }
    return ptrT._4_4_;
  }
  *ptr = node;
  iVar1 = st__add_direct(table,(char *)node,(char *)node);
  if (iVar1 != -10000) {
    return 1;
  }
  return -1;
}

Assistant:

static int
cuddEstimateCofactor(
  DdManager *dd,
  st__table *table,
  DdNode * node,
  int i,
  int phase,
  DdNode ** ptr)
{
    int tval, eval, val;
    DdNode *ptrT, *ptrE;

    if (Cudd_IsComplement(node->next)) {
        if (! st__lookup(table,(char *)node,(char **)ptr)) {
            if ( st__add_direct(table,(char *)node,(char *)node) ==
                st__OUT_OF_MEM)
                return(CUDD_OUT_OF_MEM);
            *ptr = node;
        }
        return(0);
    }
    node->next = Cudd_Not(node->next);
    if (cuddIsConstant(node)) {
        *ptr = node;
        if ( st__add_direct(table,(char *)node,(char *)node) == st__OUT_OF_MEM)
            return(CUDD_OUT_OF_MEM);
        return(1);
    }
    if ((int) node->index == i) {
        if (phase == 1) {
            *ptr = cuddT(node);
            val = ddDagInt(cuddT(node));
        } else {
            *ptr = cuddE(node);
            val = ddDagInt(Cudd_Regular(cuddE(node)));
        }
        if (node->ref > 1) {
            if ( st__add_direct(table,(char *)node,(char *)*ptr) ==
                st__OUT_OF_MEM)
                return(CUDD_OUT_OF_MEM);
        }
        return(val);
    }
    if (dd->perm[node->index] > dd->perm[i]) {
        *ptr = node;
        tval = ddDagInt(cuddT(node));
        eval = ddDagInt(Cudd_Regular(cuddE(node)));
        if (node->ref > 1) {
            if ( st__add_direct(table,(char *)node,(char *)node) ==
                st__OUT_OF_MEM)
                return(CUDD_OUT_OF_MEM);
        }
        val = 1 + tval + eval;
        return(val);
    }
    tval = cuddEstimateCofactor(dd,table,cuddT(node),i,phase,&ptrT);
    eval = cuddEstimateCofactor(dd,table,Cudd_Regular(cuddE(node)),i,
                                phase,&ptrE);
    ptrE = Cudd_NotCond(ptrE,Cudd_IsComplement(cuddE(node)));
    if (ptrT == ptrE) {         /* recombination */
        *ptr = ptrT;
        val = tval;
        if (node->ref > 1) {
            if ( st__add_direct(table,(char *)node,(char *)*ptr) ==
                    st__OUT_OF_MEM)
                return(CUDD_OUT_OF_MEM);
        }
    } else if ((ptrT != cuddT(node) || ptrE != cuddE(node)) &&
               (*ptr = cuddUniqueLookup(dd,node->index,ptrT,ptrE)) != NULL) {
        if (Cudd_IsComplement((*ptr)->next)) {
            val = 0;
        } else {
            val = 1 + tval + eval;
        }
        if (node->ref > 1) {
            if ( st__add_direct(table,(char *)node,(char *)*ptr) ==
                    st__OUT_OF_MEM)
                return(CUDD_OUT_OF_MEM);
        }
    } else {
        *ptr = node;
        val = 1 + tval + eval;
    }
    return(val);

}